

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void xcb_keyboard_handle_key(xcb_generic_event_t *event)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  
  bVar1 = event->pad0;
  if (bVar1 < 0x6f) {
    if (bVar1 == 9) {
      sighandler((int)event);
      return;
    }
    if (bVar1 != 0x1c) {
      if (bVar1 != 0x41) {
        return;
      }
      uVar2 = (uint)(animate == 0);
      if (animate == 0) {
        animate = uVar2;
        redisplay = 0;
        return;
      }
      animate = uVar2;
      redisplay = 1;
      return;
    }
    pcVar3 = getenv("NO_TEXTURE");
    if (pcVar3 == (char *)0x0) {
      setenv("NO_TEXTURE","1",1);
    }
    else {
      unsetenv("NO_TEXTURE");
    }
  }
  else {
    switch(bVar1) {
    case 0x6f:
      view_rx = view_rx + 5.0;
      break;
    case 0x70:
      view_tz = view_tz + -5.0;
      break;
    case 0x71:
      view_ry = view_ry + 5.0;
      break;
    case 0x72:
      view_ry = view_ry + -5.0;
      break;
    default:
      return;
    case 0x74:
      view_rx = view_rx + -5.0;
      break;
    case 0x75:
      view_tz = view_tz + 5.0;
    }
  }
  if (animate == 0) {
    redisplay = 0;
    return;
  }
  return;
}

Assistant:

static void xcb_keyboard_handle_key(xcb_generic_event_t *event)
{
  switch (((xcb_key_press_event_t *)event)->detail) {
    case 0x09:
      sighandler(SIGTERM);
      return;
    case 0x41:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case 0x75:
      view_tz -= -5.0;
      break;
    case 0x70:
      view_tz += -5.0;
      break;
    case 0x74:
      view_rx -= 5.0;
      break;
    case 0x6f:
      view_rx += 5.0;
      break;
    case 0x72:
      view_ry -= 5.0;
      break;
    case 0x71:
      view_ry += 5.0;
      break;
    case 0x1c:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}